

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

TStatus luaD_closeprotected(lua_State *L,ptrdiff_t level,TStatus status)

{
  CallInfo *pCVar1;
  long local_40;
  CloseP pcl;
  lu_byte old_allowhooks;
  CallInfo *old_ci;
  TStatus status_local;
  ptrdiff_t level_local;
  lua_State *L_local;
  
  pCVar1 = L->ci;
  pcl._15_1_ = L->allowhook;
  old_ci._7_1_ = status;
  while( true ) {
    local_40 = (long)(L->stack).p + level;
    pcl.level._0_1_ = old_ci._7_1_;
    old_ci._7_1_ = luaD_rawrunprotected(L,closepaux,&local_40);
    if (old_ci._7_1_ == '\0') break;
    L->ci = pCVar1;
    L->allowhook = pcl._15_1_;
  }
  return (TStatus)pcl.level;
}

Assistant:

TStatus luaD_closeprotected (lua_State *L, ptrdiff_t level, TStatus status) {
  CallInfo *old_ci = L->ci;
  lu_byte old_allowhooks = L->allowhook;
  for (;;) {  /* keep closing upvalues until no more errors */
    struct CloseP pcl;
    pcl.level = restorestack(L, level); pcl.status = status;
    status = luaD_rawrunprotected(L, &closepaux, &pcl);
    if (l_likely(status == LUA_OK))  /* no more errors? */
      return pcl.status;
    else {  /* an error occurred; restore saved state and repeat */
      L->ci = old_ci;
      L->allowhook = old_allowhooks;
    }
  }
}